

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

OpCode __thiscall
ByteCodeGenerator::GetLdSlotOp
          (ByteCodeGenerator *this,Scope *scope,int envIndex,RegSlot scopeLocation,
          FuncInfo *funcInfo)

{
  code *pcVar1;
  bool bVar2;
  ScopeType SVar3;
  FuncInfo *pFVar4;
  Scope *pSVar5;
  undefined4 *puVar6;
  OpCode local_2a;
  OpCode op;
  FuncInfo *funcInfo_local;
  RegSlot scopeLocation_local;
  int envIndex_local;
  Scope *scope_local;
  ByteCodeGenerator *this_local;
  
  if (envIndex == -1) {
    if ((scopeLocation == 0xffffffff) || (scopeLocation != funcInfo->frameSlotsRegister)) {
      if ((scopeLocation == 0xffffffff) || (scopeLocation != funcInfo->frameObjRegister)) {
        bVar2 = Scope::HasInnerScopeIndex(scope);
        if (bVar2) {
          bVar2 = Scope::GetIsObject(scope);
          if (bVar2) {
            local_2a = LdInnerObjSlot;
          }
          else {
            local_2a = LdInnerSlot;
          }
        }
        else {
          bVar2 = Scope::GetIsObject(scope);
          if (!bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x136e,"(scope->GetIsObject())","scope->GetIsObject()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          local_2a = LdObjSlot;
        }
      }
      else {
        SVar3 = Scope::GetScopeType(scope);
        if (SVar3 == ScopeType_Parameter) {
          pFVar4 = Scope::GetFunc(scope);
          pSVar5 = FuncInfo::GetCurrentChildScope(pFVar4);
          if (scope != pSVar5) {
            bVar2 = FuncInfo::IsBodyAndParamScopeMerged(funcInfo);
            if (bVar2) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x1359,"(!funcInfo->IsBodyAndParamScopeMerged())",
                                 "!funcInfo->IsBodyAndParamScopeMerged()");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar6 = 0;
            }
            return LdParamObjSlot;
          }
        }
        local_2a = LdLocalObjSlot;
      }
    }
    else {
      SVar3 = Scope::GetScopeType(scope);
      if (SVar3 == ScopeType_Parameter) {
        pFVar4 = Scope::GetFunc(scope);
        pSVar5 = FuncInfo::GetCurrentChildScope(pFVar4);
        if (scope != pSVar5) {
          bVar2 = FuncInfo::IsBodyAndParamScopeMerged(funcInfo);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x134a,"(!funcInfo->IsBodyAndParamScopeMerged())",
                               "!funcInfo->IsBodyAndParamScopeMerged()");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar6 = 0;
          }
          return LdParamSlot;
        }
      }
      local_2a = LdLocalSlot;
    }
  }
  else {
    bVar2 = Scope::GetIsObject(scope);
    if (bVar2) {
      local_2a = LdEnvObjSlot;
    }
    else {
      local_2a = LdEnvSlot;
    }
  }
  return local_2a;
}

Assistant:

Js::OpCode
ByteCodeGenerator::GetLdSlotOp(Scope *scope, int envIndex, Js::RegSlot scopeLocation, FuncInfo *funcInfo)
{
    Js::OpCode op;

    if (envIndex != -1)
    {
        if (scope->GetIsObject())
        {
            op = Js::OpCode::LdEnvObjSlot;
        }
        else
        {
            op = Js::OpCode::LdEnvSlot;
        }
    }
    else if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameSlotsRegister)
    {
        if (scope->GetScopeType() == ScopeType_Parameter && scope != scope->GetFunc()->GetCurrentChildScope())
        {
            // Symbol is from the param scope of a split scope function and we are emitting the body.
            // We should use the param scope's bytecode now.
            Assert(!funcInfo->IsBodyAndParamScopeMerged());
            op = Js::OpCode::LdParamSlot;
        }
        else
        {
            op = Js::OpCode::LdLocalSlot;
        }
    }
    else if (scopeLocation != Js::Constants::NoRegister &&
        scopeLocation == funcInfo->frameObjRegister)
    {
        if (scope->GetScopeType() == ScopeType_Parameter && scope != scope->GetFunc()->GetCurrentChildScope())
        {
            // Symbol is from the param scope of a split scope function and we are emitting the body.
            // We should use the param scope's bytecode now.
            Assert(!funcInfo->IsBodyAndParamScopeMerged());
            op = Js::OpCode::LdParamObjSlot;
        }
        else
        {
            op = Js::OpCode::LdLocalObjSlot;
        }
    }
    else if (scope->HasInnerScopeIndex())
    {
        if (scope->GetIsObject())
        {
            op = Js::OpCode::LdInnerObjSlot;
        }
        else
        {
            op = Js::OpCode::LdInnerSlot;
        }
    }
    else
    {
        AssertOrFailFast(scope->GetIsObject());
        op = Js::OpCode::LdObjSlot;
    }

    return op;
}